

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O0

ByteArray * __thiscall
ByteArray::mid(ByteArray *__return_storage_ptr__,ByteArray *this,size_t start,ssize_t length)

{
  size_t local_28;
  ssize_t length_local;
  size_t start_local;
  ByteArray *this_local;
  ByteArray *ret;
  
  ByteArray(__return_storage_ptr__);
  local_28 = length;
  if (length < 0) {
    local_28 = this->size_ - start;
  }
  if (start < this->size_) {
    grow(__return_storage_ptr__,local_28);
    __return_storage_ptr__->size_ = local_28;
    memcpy(__return_storage_ptr__->data_,this->data_ + start,local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteArray ByteArray::mid(size_t start, ssize_t length)
{
	ByteArray ret;

	if (length < 0)
		length = size_-start;

	if (start >= size_)
		return ret;

	ret.grow(length);
	ret.size_ = length;
	memcpy(ret.data_,&data_[start],length);
	return ret;
}